

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

bool __thiscall Lowerer::GenerateFastInlineStringFromCodePoint(Lowerer *this,Instr *instr)

{
  Opnd *pOVar1;
  code *pcVar2;
  bool bVar3;
  ArgSlot AVar4;
  undefined4 *puVar5;
  Instr *pIVar6;
  SymOpnd *pSVar7;
  StackSym *this_00;
  Instr *pIVar8;
  RegOpnd *resultOpnd;
  LabelInstr *doneLabel;
  LabelInstr *labelFail;
  RegOpnd *pRVar9;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_60 [4];
  AutoReuseOpnd autoReuseFromCodePointIntArgOpnd;
  
  if (instr->m_opcode != CallDirect) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4d7e,"(instr->m_opcode == Js::OpCode::CallDirect)",
                       "instr->m_opcode == Js::OpCode::CallDirect");
    if (!bVar3) goto LAB_0054bdd6;
    *puVar5 = 0;
  }
  pIVar6 = Inline::GetDefInstr(instr->m_src2);
  pOVar1 = pIVar6->m_src2;
  pSVar7 = IR::Opnd::AsSymOpnd(pOVar1);
  this_00 = Sym::AsStackSym(pSVar7->m_sym);
  AVar4 = StackSym::GetArgSlotNum(this_00);
  if (AVar4 != 2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4d8d,"(argCount == 2)","argCount == 2");
    if (!bVar3) goto LAB_0054bdd6;
    *puVar5 = 0;
  }
  pIVar8 = Inline::GetDefInstr(pOVar1);
  if (pIVar8->m_opcode != ArgOut_A) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4d91,"(argInstr->m_opcode == Js::OpCode::ArgOut_A)",
                       "argInstr->m_opcode == Js::OpCode::ArgOut_A");
    if (!bVar3) {
LAB_0054bdd6:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pOVar1 = pIVar8->m_src1;
  local_60[0] = (pOVar1->m_valueType).field_0;
  autoReuseFromCodePointIntArgOpnd._16_8_ = pIVar6;
  bVar3 = ValueType::IsLikelyInt((ValueType *)&local_60[0].field_0);
  if (bVar3) {
    bVar3 = IR::Opnd::IsRegOpnd(instr->m_dst);
    if ((!bVar3) || (bVar3 = IR::Opnd::IsEqual(instr->m_dst,pOVar1), bVar3)) {
      resultOpnd = IR::RegOpnd::New(TyVar,this->m_func);
    }
    else {
      resultOpnd = IR::Opnd::AsRegOpnd(instr->m_dst);
    }
    doneLabel = IR::LabelInstr::New(Label,this->m_func,false);
    labelFail = IR::LabelInstr::New(Label,this->m_func,true);
    pRVar9 = IR::RegOpnd::New(TyVar,instr->m_func);
    IR::AutoReuseOpnd::AutoReuseOpnd
              ((AutoReuseOpnd *)&local_60[0].field_0,&pRVar9->super_Opnd,instr->m_func,true);
    InsertMove(&pRVar9->super_Opnd,pOVar1,instr,true);
    pRVar9 = GenerateUntagVar(this,pRVar9,labelFail,instr,true);
    GenerateGetSingleCharString(this,pRVar9,&resultOpnd->super_Opnd,labelFail,doneLabel,instr,true);
    IR::Instr::InsertBefore(instr,&labelFail->super_Instr);
    IR::Instr::InsertAfter(instr,&doneLabel->super_Instr);
    RelocateCallDirectToHelperPath
              ((Lowerer *)instr,(Instr *)autoReuseFromCodePointIntArgOpnd._16_8_,labelFail);
    IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&local_60[0].field_0);
    return true;
  }
  return true;
}

Assistant:

bool
Lowerer::GenerateFastInlineStringFromCodePoint(IR::Instr* instr)
{
    Assert(instr->m_opcode == Js::OpCode::CallDirect);

//  ArgOut sequence
//  s8.var          =  StartCall      2 (0x2).i32                             #000c
//  arg1(s9)<0>.var =  ArgOut_A       s2.var, s8.var                          #0014 //Implicit this, String object
//  arg2(s10)<4>.var = ArgOut_A       s3.var, arg1(s9)<0>.var                 #0018 //First argument to FromCharCode
//  arg1(s11)<0>.u32 = ArgOut_A_InlineSpecialized  0x012C26C0 (DynamicObject).var, arg2(s10)<4>.var #
//  s0[LikelyTaggedInt].var = CallDirect  String_FromCodePoint.u32, arg1(s11)<0>.u32 #001c

    IR::Opnd * linkOpnd = instr->GetSrc2();
    IR::Instr * tmpInstr = Inline::GetDefInstr(linkOpnd);// linkOpnd->AsSymOpnd()->m_sym->AsStackSym()->m_instrDef;
    linkOpnd = tmpInstr->GetSrc2();

#if DBG
    IntConstType argCount = linkOpnd->AsSymOpnd()->m_sym->AsStackSym()->GetArgSlotNum();
    Assert(argCount == 2);
#endif

    IR::Instr *argInstr = Inline::GetDefInstr(linkOpnd);
    Assert(argInstr->m_opcode == Js::OpCode::ArgOut_A);
    IR::Opnd *src1 = argInstr->GetSrc1();

    if (src1->GetValueType().IsLikelyInt())
    {
        //Trying to generate this code
        //      MOV resultOpnd, dst
        //      MOV fromCharCodeIntArgOpnd, src1
        //      SAR fromCharCodeIntArgOpnd, Js::VarTag_Shift
        //      JAE $Helper
        //      CMP fromCharCodeIntArgOpnd, Js::ScriptContext::CharStringCacheSize
        //
        //      JAE $labelWCharStringCheck                                   <
        //      MOV resultOpnd, GetCharStringCache[fromCharCodeIntArgOpnd]
        //      TST resultOpnd, resultOpnd          //Check for null
        //      JEQ $helper
        //      JMP $Done
        //
        //$labelWCharStringCheck:
        //      resultOpnd =  Call HelperGetStringForCharW
        //      JMP $Done
        //$helper:
        IR::RegOpnd * resultOpnd = nullptr;
        if (!instr->GetDst()->IsRegOpnd() || instr->GetDst()->IsEqual(src1))
        {
            resultOpnd = IR::RegOpnd::New(TyVar, this->m_func);
        }
        else
        {
            resultOpnd = instr->GetDst()->AsRegOpnd();
        }

        IR::LabelInstr *doneLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
        IR::LabelInstr *labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);

        IR::RegOpnd * fromCodePointIntArgOpnd = IR::RegOpnd::New(TyVar, instr->m_func);
        IR::AutoReuseOpnd autoReuseFromCodePointIntArgOpnd(fromCodePointIntArgOpnd, instr->m_func);
        InsertMove(fromCodePointIntArgOpnd, src1, instr);

        //Check for tagged int and get the untagged version.
        fromCodePointIntArgOpnd = GenerateUntagVar(fromCodePointIntArgOpnd, labelHelper, instr);

        GenerateGetSingleCharString(fromCodePointIntArgOpnd, resultOpnd, labelHelper, doneLabel, instr, true);

        instr->InsertBefore(labelHelper);

        instr->InsertAfter(doneLabel);

        RelocateCallDirectToHelperPath(tmpInstr, labelHelper);
    }
    return true;
}